

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_queue.h
# Opt level: O1

bool __thiscall
WorkQueue<CMU462::WorkItem>::try_get_work(WorkQueue<CMU462::WorkItem> *this,WorkItem *outPtr)

{
  pointer __src;
  pointer *ppWVar1;
  pointer pWVar2;
  pointer pWVar3;
  pointer __dest;
  pointer pWVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar7 == 0) {
    pWVar2 = (this->storage).super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pWVar3 = (this->storage).super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pWVar2 != pWVar3) {
      iVar7 = pWVar2->tile_y;
      iVar5 = pWVar2->tile_w;
      iVar6 = pWVar2->tile_h;
      outPtr->tile_x = pWVar2->tile_x;
      outPtr->tile_y = iVar7;
      outPtr->tile_w = iVar5;
      outPtr->tile_h = iVar6;
      __dest = (this->storage).
               super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>._M_impl.
               super__Vector_impl_data._M_start;
      pWVar4 = (this->storage).
               super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
      __src = __dest + 1;
      if (__src != pWVar4) {
        memmove(__dest,__src,(long)pWVar4 - (long)__src);
      }
      ppWVar1 = &(this->storage).
                 super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppWVar1 = *ppWVar1 + -1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return pWVar2 != pWVar3;
  }
  std::__throw_system_error(iVar7);
}

Assistant:

bool try_get_work(T *outPtr) {
      lock.lock();
      if (storage.empty()) {
        lock.unlock();
        return false;
      }
      *outPtr = storage.front();
      storage.erase(storage.begin());
      lock.unlock();
      return true;
    }